

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

int intra_edge_filter_strength(int bs0,int bs1,int delta,int type)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = -delta;
  if (0 < delta) {
    uVar1 = delta;
  }
  uVar2 = bs0 + bs1;
  if (type == 0) {
    if ((int)uVar2 < 9) {
      bVar4 = uVar1 < 0x38;
LAB_003acaa0:
      return (int)!bVar4;
    }
    if ((uVar2 < 0xd) || (uVar2 < 0x11)) {
      bVar4 = uVar1 < 0x28;
      goto LAB_003acaa0;
    }
    if (uVar2 < 0x19) {
      bVar4 = 7 < uVar1;
      bVar3 = uVar1 < 0x10;
    }
    else {
      if (0x20 < uVar2) goto LAB_003acaeb;
      bVar4 = delta != 0;
      bVar3 = uVar1 < 4;
    }
    uVar2 = 2;
    if (bVar3) {
      uVar2 = (uint)bVar4;
    }
    bVar4 = uVar1 < 0x20;
    uVar1 = 3;
  }
  else {
    if ((int)uVar2 < 9) {
      bVar3 = 0x27 < uVar1;
      bVar4 = uVar1 < 0x40;
    }
    else {
      if (0x10 < uVar2) {
        if (uVar2 < 0x19) {
          bVar4 = 3 < uVar1;
          goto LAB_003acaf2;
        }
LAB_003acaeb:
        bVar4 = delta != 0;
LAB_003acaf2:
        return (uint)bVar4 * 3;
      }
      bVar3 = 0x13 < uVar1;
      bVar4 = uVar1 < 0x30;
    }
    uVar2 = (uint)bVar3;
    uVar1 = 2;
  }
  if (bVar4) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

static int intra_edge_filter_strength(int bs0, int bs1, int delta, int type) {
  const int d = abs(delta);
  int strength = 0;

  const int blk_wh = bs0 + bs1;
  if (type == 0) {
    if (blk_wh <= 8) {
      if (d >= 56) strength = 1;
    } else if (blk_wh <= 12) {
      if (d >= 40) strength = 1;
    } else if (blk_wh <= 16) {
      if (d >= 40) strength = 1;
    } else if (blk_wh <= 24) {
      if (d >= 8) strength = 1;
      if (d >= 16) strength = 2;
      if (d >= 32) strength = 3;
    } else if (blk_wh <= 32) {
      if (d >= 1) strength = 1;
      if (d >= 4) strength = 2;
      if (d >= 32) strength = 3;
    } else {
      if (d >= 1) strength = 3;
    }
  } else {
    if (blk_wh <= 8) {
      if (d >= 40) strength = 1;
      if (d >= 64) strength = 2;
    } else if (blk_wh <= 16) {
      if (d >= 20) strength = 1;
      if (d >= 48) strength = 2;
    } else if (blk_wh <= 24) {
      if (d >= 4) strength = 3;
    } else {
      if (d >= 1) strength = 3;
    }
  }
  return strength;
}